

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O0

MusInfo * MOD_OpenSong(FileReader *reader)

{
  bool bVar1;
  uint size_00;
  int iVar2;
  uint uVar3;
  long lVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DUMBFILE *in_stack_ffffffffffffff40;
  DUMBFILE *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff64;
  undefined2 in_stack_ffffffffffffff6c;
  byte bVar5;
  byte bVar6;
  int size;
  bool is_dos;
  bool is_it;
  input_mod *state;
  long fpos;
  DUMBFILE *f;
  dumbfile_mem_status filestate;
  int local_60;
  BYTE start [64];
  int headsize;
  DUH *duh;
  FileReader *reader_local;
  DUMBFILE *f_00;
  
  stack0xffffffffffffffe0 = (DUH *)0x0;
  fpos = 0;
  _size = (input_mod *)0x0;
  bVar1 = FBoolCVar::operator_cast_to_bool(&mod_dumb);
  if (bVar1) {
    bVar6 = 0;
    bVar5 = 1;
    addterm(dumb_exit,"dumb_exit");
    lVar4 = FileReader::GetLength(reader);
    size_00 = (uint)lVar4;
    iVar2 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[3])();
    f_00 = (DUMBFILE *)CONCAT44(extraout_var,iVar2);
    f = (DUMBFILE *)&filestate.size;
    filestate.ptr._0_4_ = 0;
    uVar3 = size_00;
    if (0x40 < (int)size_00) {
      uVar3 = 0x40;
    }
    lVar4 = (long)(int)uVar3;
    start._56_4_ = uVar3;
    iVar2 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])
                      (reader,&filestate.size,(long)(int)uVar3);
    if (lVar4 == CONCAT44(extraout_var_00,iVar2)) {
      if (((int)size_00 < 4) ||
         (CONCAT13(filestate.size._3_1_,
                   CONCAT12(filestate.size._2_1_,CONCAT11(filestate.size._1_1_,(char)filestate.size)
                           )) != 0x4d504d49)) {
        if (((int)size_00 < 0x11) ||
           (iVar2 = memcmp(&filestate.size,"Extended Module: ",0x11), iVar2 != 0)) {
          if (((int)size_00 < 0x30) || (start._36_4_ != 0x4d524353)) {
            if (((int)size_00 < 0x490) ||
               ((start[0x15] != '\x02' ||
                (((start._12_8_ != 0x216d616572635321 && (start._12_8_ != 0x4d545332444f4d42)) &&
                 (start._12_8_ != 0x21444f4d415a5557)))))) {
              if (((int)size_00 < 2) ||
                 ((((char)filestate.size != 'i' || (filestate.size._1_1_ != 'f')) &&
                  (((char)filestate.size != 'J' || (filestate.size._1_1_ != 'N')))))) {
                if (((int)size_00 < 0x30) || (start._36_4_ != 0x464d5450)) {
                  if (((int)size_00 < 4) ||
                     (CONCAT13(filestate.size._3_1_,
                               CONCAT12(filestate.size._2_1_,
                                        CONCAT11(filestate.size._1_1_,(char)filestate.size))) !=
                      0x204d5350)) {
                    if (((int)size_00 < 4) ||
                       (CONCAT13(filestate.size._3_1_,
                                 CONCAT12(filestate.size._2_1_,
                                          CONCAT11(filestate.size._1_1_,(char)filestate.size))) !=
                        -0x1b2acb0)) {
                      if (((int)size_00 < 3) ||
                         ((((char)filestate.size != 'M' || (filestate.size._1_1_ != 'T')) ||
                          (filestate.size._2_1_ != 'M')))) {
                        if ((((int)size_00 < 0xc) ||
                            (CONCAT13(filestate.size._3_1_,
                                      CONCAT12(filestate.size._2_1_,
                                               CONCAT11(filestate.size._1_1_,(char)filestate.size)))
                             != 0x46464952)) ||
                           ((start._0_4_ != 0x464d5344 &&
                            ((start._0_4_ != 0x20204d41 && (start._0_4_ != 0x46464d41)))))) {
                          if (((int)size_00 < 0x20) ||
                             ((iVar2 = memcmp(&filestate.size,"ASYLUM Music Format",0x13),
                              iVar2 != 0 || (iVar2 = memcmp(start + 0xb," V1.0",5), iVar2 != 0)))) {
                            if ((7 < (int)size_00) &&
                               (((CONCAT13(filestate.size._3_1_,
                                           CONCAT12(filestate.size._2_1_,
                                                    CONCAT11(filestate.size._1_1_,
                                                             (char)filestate.size))) == 0x41544b4f
                                 && (local_60 == 0x474e4f53)) &&
                                (fpos = (long)dumb_read_allfile((dumbfile_mem_status *)&f,
                                                                (BYTE *)&filestate.size,reader,
                                                                start._56_4_,size_00),
                                (DUMBFILE *)fpos != (DUMBFILE *)0x0)))) {
                              register0x00000000 =
                                   dumb_read_okt_quick((DUMBFILE *)
                                                       CONCAT44(in_stack_ffffffffffffff5c,uVar3));
                            }
                          }
                          else {
                            fpos = (long)dumb_read_allfile((dumbfile_mem_status *)&f,
                                                           (BYTE *)&filestate.size,reader,
                                                           start._56_4_,size_00);
                            if ((DUMBFILE *)fpos != (DUMBFILE *)0x0) {
                              register0x00000000 =
                                   dumb_read_asy_quick((DUMBFILE *)
                                                       CONCAT17(bVar6,CONCAT16(bVar5,CONCAT24(
                                                  in_stack_ffffffffffffff6c,size_00))));
                            }
                          }
                        }
                        else {
                          fpos = (long)dumb_read_allfile((dumbfile_mem_status *)&f,
                                                         (BYTE *)&filestate.size,reader,start._56_4_
                                                         ,size_00);
                          if ((DUMBFILE *)fpos != (DUMBFILE *)0x0) {
                            register0x00000000 = dumb_read_riff_quick(in_stack_ffffffffffffff48);
                          }
                        }
                      }
                      else {
                        fpos = (long)dumb_read_allfile((dumbfile_mem_status *)&f,
                                                       (BYTE *)&filestate.size,reader,start._56_4_,
                                                       size_00);
                        if ((DUMBFILE *)fpos != (DUMBFILE *)0x0) {
                          register0x00000000 = dumb_read_mtm_quick(f_00);
                        }
                      }
                    }
                    else {
                      fpos = (long)dumb_read_allfile((dumbfile_mem_status *)&f,
                                                     (BYTE *)&filestate.size,reader,start._56_4_,
                                                     size_00);
                      if ((DUMBFILE *)fpos != (DUMBFILE *)0x0) {
                        register0x00000000 =
                             dumb_read_old_psm_quick
                                       ((DUMBFILE *)
                                        CONCAT17(bVar6,CONCAT16(bVar5,CONCAT24(
                                                  in_stack_ffffffffffffff6c,size_00))));
                      }
                    }
                  }
                  else {
                    fpos = (long)dumb_read_allfile((dumbfile_mem_status *)&f,(BYTE *)&filestate.size
                                                   ,reader,start._56_4_,size_00);
                    if ((DUMBFILE *)fpos != (DUMBFILE *)0x0) {
                      register0x00000000 =
                           dumb_read_psm_quick((DUMBFILE *)
                                               CONCAT17(filestate.size._3_1_,
                                                        CONCAT16(filestate.size._2_1_,
                                                                 CONCAT15(filestate.size._1_1_,
                                                                          CONCAT14((char)filestate.
                                                                                         size,
                                                                                   filestate.offset)
                                                                         ))),filestate.ptr._4_4_);
                    }
                  }
                }
                else {
                  fpos = (long)dumb_read_allfile((dumbfile_mem_status *)&f,(BYTE *)&filestate.size,
                                                 reader,start._56_4_,size_00);
                  if ((DUMBFILE *)fpos != (DUMBFILE *)0x0) {
                    register0x00000000 =
                         dumb_read_ptm_quick((DUMBFILE *)
                                             CONCAT17(bVar6,CONCAT16(bVar5,CONCAT24(
                                                  in_stack_ffffffffffffff6c,size_00))));
                  }
                }
              }
              else {
                fpos = (long)dumb_read_allfile((dumbfile_mem_status *)&f,(BYTE *)&filestate.size,
                                               reader,start._56_4_,size_00);
                if ((DUMBFILE *)fpos != (DUMBFILE *)0x0) {
                  register0x00000000 =
                       dumb_read_669_quick((DUMBFILE *)
                                           CONCAT17(bVar6,CONCAT16(bVar5,CONCAT24(
                                                  in_stack_ffffffffffffff6c,size_00))));
                }
              }
            }
            else {
              fpos = (long)dumb_read_allfile((dumbfile_mem_status *)&f,(BYTE *)&filestate.size,
                                             reader,start._56_4_,size_00);
              if ((DUMBFILE *)fpos != (DUMBFILE *)0x0) {
                register0x00000000 = dumb_read_stm_quick(f_00);
              }
            }
          }
          else {
            fpos = (long)dumb_read_allfile((dumbfile_mem_status *)&f,(BYTE *)&filestate.size,reader,
                                           start._56_4_,size_00);
            if ((DUMBFILE *)fpos != (DUMBFILE *)0x0) {
              register0x00000000 = dumb_read_s3m_quick(f);
            }
          }
        }
        else {
          fpos = (long)dumb_read_allfile((dumbfile_mem_status *)&f,(BYTE *)&filestate.size,reader,
                                         start._56_4_,size_00);
          if ((DUMBFILE *)fpos != (DUMBFILE *)0x0) {
            register0x00000000 = dumb_read_xm_quick(f_00);
          }
        }
      }
      else {
        bVar6 = 1;
        fpos = (long)dumb_read_allfile((dumbfile_mem_status *)&f,(BYTE *)&filestate.size,reader,
                                       start._56_4_,size_00);
        if ((DUMBFILE *)fpos != (DUMBFILE *)0x0) {
          register0x00000000 =
               dumb_read_it_quick((DUMBFILE *)
                                  CONCAT17(bVar6,CONCAT16(bVar5,CONCAT24(in_stack_ffffffffffffff6c,
                                                                         size_00))));
        }
      }
      if (stack0xffffffffffffffe0 == (DUH *)0x0) {
        bVar5 = 0;
        if (f == (DUMBFILE *)&filestate.size) {
          fpos = (long)dumb_read_allfile((dumbfile_mem_status *)&f,(BYTE *)&filestate.size,reader,
                                         start._56_4_,size_00);
          if ((DUMBFILE *)fpos == (DUMBFILE *)0x0) {
            (*(reader->super_FileReaderBase)._vptr_FileReaderBase[4])(reader,f_00,0);
            return (MusInfo *)0x0;
          }
        }
        else {
          filestate.ptr._0_4_ = 0;
        }
        register0x00000000 =
             dumb_read_mod_quick((DUMBFILE *)
                                 CONCAT17(bVar6,CONCAT16(bVar5,CONCAT24(in_stack_ffffffffffffff6c,
                                                                        size_00))),
                                 in_stack_ffffffffffffff64);
      }
      if (fpos != 0) {
        dumbfile_close(in_stack_ffffffffffffff40);
      }
      if (stack0xffffffffffffffe0 == (DUH *)0x0) {
        (*(reader->super_FileReaderBase)._vptr_FileReaderBase[4])(reader,f_00,0);
      }
      else {
        bVar1 = FBoolCVar::operator_cast_to_bool(&mod_autochip);
        if (bVar1) {
          MOD_SetAutoChip(stack0xffffffffffffffe0);
        }
        _size = (input_mod *)operator_new(0x88);
        input_mod::input_mod(_size,stack0xffffffffffffffe0);
        uVar3 = (*(_size->super_StreamSong).super_MusInfo._vptr_MusInfo[10])();
        if ((uVar3 & 1) == 0) {
          if (_size != (input_mod *)0x0) {
            (*(_size->super_StreamSong).super_MusInfo._vptr_MusInfo[1])();
          }
          _size = (input_mod *)0x0;
        }
        else if ((bVar6 & 1) == 0) {
          ReadDUH(stack0xffffffffffffffe0,_size,false,(bool)(bVar5 & 1));
        }
        else {
          ReadIT((BYTE *)f,size_00,_size,false);
        }
      }
      if ((f != (DUMBFILE *)&filestate.size) && (f != (DUMBFILE *)0x0)) {
        operator_delete__(f);
      }
      reader_local = (FileReader *)_size;
    }
    else {
      reader_local = (FileReader *)0x0;
    }
  }
  else {
    reader_local = (FileReader *)0x0;
  }
  return (MusInfo *)reader_local;
}

Assistant:

MusInfo *MOD_OpenSong(FileReader &reader)
{
	DUH *duh = 0;
	int headsize;
	union
	{
		BYTE start[64];
		DWORD dstart[64/4];
	};
	dumbfile_mem_status filestate;
	DUMBFILE *f = NULL;
	long fpos = 0;
	input_mod *state = NULL;

	if (!mod_dumb)
	{
		return NULL;
	}

	bool is_it = false;
	bool is_dos = true;

	atterm(dumb_exit);

    int size = reader.GetLength();
    fpos = reader.Tell();

	filestate.ptr = start;
	filestate.offset = 0;
	headsize = MIN((int)sizeof(start), size);

    if (headsize != reader.Read(start, headsize))
    {
        return NULL;
    }

	if (size >= 4 && dstart[0] == MAKE_ID('I','M','P','M'))
	{
		is_it = true;
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_it_quick(f);
		}
	}
	else if (size >= 17 && !memcmp(start, "Extended Module: ", 17))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_xm_quick(f);
		}
	}
	else if (size >= 0x30 && dstart[11] == MAKE_ID('S','C','R','M'))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_s3m_quick(f);
		}
	}
	else if (size >= 1168 &&
		/*start[28] == 0x1A &&*/ start[29] == 2 &&
		( !memcmp( &start[20], "!Scream!", 8 ) ||
		  !memcmp( &start[20], "BMOD2STM", 8 ) ||
		  !memcmp( &start[20], "WUZAMOD!", 8 ) ) )
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_stm_quick(f);
		}
	}
	else if (size >= 2 &&
		((start[0] == 0x69 && start[1] == 0x66) ||
		 (start[0] == 0x4A && start[1] == 0x4E)))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_669_quick(f);
		}
	}
	else if (size >= 0x30 && dstart[11] == MAKE_ID('P','T','M','F'))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_ptm_quick(f);
		}
	}
	else if (size >= 4 && dstart[0] == MAKE_ID('P','S','M',' '))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_psm_quick(f, 0/*start_order*/);
			/*start_order = 0;*/
		}
	}
	else if (size >= 4 && dstart[0] == (DWORD)MAKE_ID('P','S','M',254))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_old_psm_quick(f);
		}
	}
	else if (size >= 3 && start[0] == 'M' && start[1] == 'T' && start[2] == 'M')
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_mtm_quick(f);
		}
	}
	else if (size >= 12 && dstart[0] == MAKE_ID('R','I','F','F') &&
		(dstart[2] == MAKE_ID('D','S','M','F') ||
		 dstart[2] == MAKE_ID('A','M',' ',' ') ||
		 dstart[2] == MAKE_ID('A','M','F','F')))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_riff_quick(f);
		}
	}
	else if (size >= 32 &&
		!memcmp( start, "ASYLUM Music Format", 19 ) &&
		!memcmp( start + 19, " V1.0", 5 ) )
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_asy_quick(f);
		}
	}
	else if (size >= 8 &&
		dstart[0] == MAKE_ID('O','K','T','A') &&
		dstart[1] == MAKE_ID('S','O','N','G'))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_okt_quick(f);
		}
	}

	if ( ! duh )
	{
		is_dos = false;
		if (filestate.ptr == (BYTE *)start)
		{
			if (!(f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
			{
                reader.Seek(fpos, SEEK_SET);
				return NULL;
			}
		}
		else
		{
			filestate.offset = 0;
		}
		// No way to get the filename, so we can't check for a .mod extension, and
		// therefore, trying to load an old 15-instrument SoundTracker module is not
		// safe. We'll restrict MOD loading to 31-instrument modules with known
		// signatures and let the sound system worry about 15-instrument ones.
		// (Assuming it even supports them)
		duh = dumb_read_mod_quick(f, TRUE);
	}

	if (f != NULL)
	{
		dumbfile_close(f);
	}
	if ( duh )
	{
		if (mod_autochip)
		{
			MOD_SetAutoChip(duh);
		}
		state = new input_mod(duh);
		if (!state->IsValid())
		{
			delete state;
			state = NULL;
		}
		else
		{
			if (is_it) ReadIT(filestate.ptr, size, state, false);
			else ReadDUH(duh, state, false, is_dos);
		}
	}
	else
	{
		// Reposition file pointer for other codecs to do their checks.
        reader.Seek(fpos, SEEK_SET);
	}
	if (filestate.ptr != (BYTE *)start)
	{
		delete[] const_cast<BYTE *>(filestate.ptr);
	}
	return state;
}